

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::CostAttributes::initializeCost
          (CostAttributes *this,MatrixDynSize *inputSelector)

{
  MatrixDynSize *in_RDI;
  uint totalDimension;
  uint rangeSize;
  uint in_stack_00000118;
  uint in_stack_0000011c;
  CostAttributes *in_stack_00000120;
  shared_ptr<iDynTree::optimalcontrol::MatrixSelector> *in_stack_ffffffffffffffc8;
  
  std::make_shared<iDynTree::optimalcontrol::MatrixSelector,iDynTree::MatrixDynSize_const&>(in_RDI);
  std::shared_ptr<iDynTree::optimalcontrol::Selector>::operator=
            ((shared_ptr<iDynTree::optimalcontrol::Selector> *)in_RDI,in_stack_ffffffffffffffc8);
  std::shared_ptr<iDynTree::optimalcontrol::MatrixSelector>::~shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::MatrixSelector> *)0x34ce67);
  iDynTree::MatrixDynSize::rows();
  iDynTree::MatrixDynSize::cols();
  initializeBuffers(in_stack_00000120,in_stack_0000011c,in_stack_00000118);
  return;
}

Assistant:

void initializeCost(const MatrixDynSize& inputSelector) {
                this->selector = std::make_shared<MatrixSelector>(inputSelector);
                unsigned int rangeSize = inputSelector.rows();
                unsigned int totalDimension = inputSelector.cols();
                initializeBuffers(rangeSize, totalDimension);
            }